

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

UniValue *
blockheaderToJSON(UniValue *__return_storage_ptr__,CBlockIndex *tip,CBlockIndex *blockindex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint256 *puVar2;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  int iVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  int confirmations;
  undefined1 in_stack_fffffffffffff848 [12];
  int in_stack_fffffffffffff854;
  undefined8 in_stack_fffffffffffff858;
  _Alloc_hider in_stack_fffffffffffff860;
  size_type in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff878 [56];
  undefined8 in_stack_fffffffffffff8b0;
  long *plVar5;
  pointer in_stack_fffffffffffff8b8;
  long local_740 [2];
  UniValue local_730;
  long *local_6d8 [2];
  long local_6c8 [2];
  UniValue local_6b8;
  long *local_660 [2];
  long local_650 [2];
  UniValue local_640;
  long *local_5e8 [2];
  long local_5d8 [2];
  UniValue local_5c8;
  long *local_570 [2];
  long local_560 [2];
  UniValue local_550;
  long *local_4f8 [2];
  long local_4e8 [2];
  UniValue local_4d8;
  long *local_480 [2];
  long local_470 [2];
  UniValue local_460;
  long *local_408 [2];
  long local_3f8 [2];
  UniValue local_3e8;
  long *local_390 [2];
  long local_380 [2];
  UniValue local_370;
  long *local_318 [2];
  long local_308 [2];
  UniValue local_2f8;
  long *local_2a0 [2];
  long local_290 [2];
  UniValue local_280;
  long *local_228 [2];
  long local_218 [2];
  UniValue local_208;
  long *local_1b0 [2];
  long local_1a0 [2];
  UniValue local_190;
  long *local_138 [2];
  long local_128 [2];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  string local_f0;
  UniValue local_d0;
  long *local_78 [2];
  long local_68 [2];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"hash","");
  puVar2 = blockindex->phashBlock;
  if (puVar2 != (uint256 *)0x0) {
    local_118 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    uStack_110 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_108 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_100 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    base_blob<256u>::GetHex_abi_cxx11_(&local_f0,&local_118);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d0,&local_f0);
    key._M_string_length._4_4_ = in_stack_fffffffffffff854;
    key._0_12_ = in_stack_fffffffffffff848;
    key.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val._0_8_ = in_stack_fffffffffffff868;
    val.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
      operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    pCVar4 = CBlockIndex::GetAncestor(tip,blockindex->nHeight + 1);
    if ((pCVar4 == (CBlockIndex *)0x0) || (pCVar4->pprev != blockindex)) {
      iVar3 = (uint)(blockindex == tip) * 2 + -1;
      pCVar4 = (CBlockIndex *)0x0;
    }
    else {
      iVar3 = (tip->nHeight - blockindex->nHeight) + 1;
    }
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"confirmations","");
    UniValue::UniValue<int_&,_int,_true>(&local_190,(int *)&stack0xfffffffffffff854);
    key_00._M_string_length._4_4_ = iVar3;
    key_00._0_12_ = in_stack_fffffffffffff848;
    key_00.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_00.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_00._0_8_ = in_stack_fffffffffffff868;
    val_00.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_00.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_190.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_190.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.val._M_dataplus._M_p != &local_190.val.field_2) {
      operator_delete(local_190.val._M_dataplus._M_p,local_190.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"height","");
    UniValue::UniValue<const_int_&,_int,_true>(&local_208,&blockindex->nHeight);
    key_01._M_string_length._4_4_ = iVar3;
    key_01._0_12_ = in_stack_fffffffffffff848;
    key_01.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_01.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_01._0_8_ = in_stack_fffffffffffff868;
    val_01.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_01.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_208.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.val._M_dataplus._M_p != &local_208.val.field_2) {
      operator_delete(local_208.val._M_dataplus._M_p,local_208.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"version","");
    UniValue::UniValue<const_int_&,_int,_true>(&local_280,&blockindex->nVersion);
    key_02._M_string_length._4_4_ = iVar3;
    key_02._0_12_ = in_stack_fffffffffffff848;
    key_02.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_02.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_02._0_8_ = in_stack_fffffffffffff868;
    val_02.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_02.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_280.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_280.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280.val._M_dataplus._M_p != &local_280.val.field_2) {
      operator_delete(local_280.val._M_dataplus._M_p,local_280.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"versionHex","");
    paVar1 = &local_f0.field_2;
    tinyformat::format<int>(&local_f0,"%08x",&blockindex->nVersion);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_2f8,&local_f0);
    key_03._M_string_length._4_4_ = iVar3;
    key_03._0_12_ = in_stack_fffffffffffff848;
    key_03.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_03.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_03._0_8_ = in_stack_fffffffffffff868;
    val_03.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_03.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_03,val_03);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2f8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.val._M_dataplus._M_p != &local_2f8.val.field_2) {
      operator_delete(local_2f8.val._M_dataplus._M_p,local_2f8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    local_318[0] = local_308;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"merkleroot","");
    base_blob<256u>::GetHex_abi_cxx11_(&local_f0,&blockindex->hashMerkleRoot);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_370,&local_f0);
    key_04._M_string_length._4_4_ = iVar3;
    key_04._0_12_ = in_stack_fffffffffffff848;
    key_04.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_04.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_04._0_8_ = in_stack_fffffffffffff868;
    val_04.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_04.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_04,val_04);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_370.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_370.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.val._M_dataplus._M_p != &local_370.val.field_2) {
      operator_delete(local_370.val._M_dataplus._M_p,local_370.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_318[0] != local_308) {
      operator_delete(local_318[0],local_308[0] + 1);
    }
    local_390[0] = local_380;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"time","");
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_3e8,&blockindex->nTime);
    key_05._M_string_length._4_4_ = iVar3;
    key_05._0_12_ = in_stack_fffffffffffff848;
    key_05.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_05.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_05.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_05._0_8_ = in_stack_fffffffffffff868;
    val_05.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_05.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_05,val_05);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3e8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3e8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8.val._M_dataplus._M_p != &local_3e8.val.field_2) {
      operator_delete(local_3e8.val._M_dataplus._M_p,local_3e8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_390[0] != local_380) {
      operator_delete(local_390[0],local_380[0] + 1);
    }
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"mediantime","");
    local_f0._M_dataplus._M_p = (pointer)CBlockIndex::GetMedianTimePast(blockindex);
    UniValue::UniValue<long,_long,_true>(&local_460,(long *)&local_f0);
    key_06._M_string_length._4_4_ = iVar3;
    key_06._0_12_ = in_stack_fffffffffffff848;
    key_06.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_06.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_06.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_06._0_8_ = in_stack_fffffffffffff868;
    val_06.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_06.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_06,val_06);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_460.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_460.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460.val._M_dataplus._M_p != &local_460.val.field_2) {
      operator_delete(local_460.val._M_dataplus._M_p,local_460.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_408[0] != local_3f8) {
      operator_delete(local_408[0],local_3f8[0] + 1);
    }
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"nonce","");
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_4d8,&blockindex->nNonce);
    key_07._M_string_length._4_4_ = iVar3;
    key_07._0_12_ = in_stack_fffffffffffff848;
    key_07.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_07.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_07.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_07._0_8_ = in_stack_fffffffffffff868;
    val_07.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_07.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_07,val_07);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4d8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4d8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8.val._M_dataplus._M_p != &local_4d8.val.field_2) {
      operator_delete(local_4d8.val._M_dataplus._M_p,local_4d8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    local_4f8[0] = local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"bits","");
    tinyformat::format<unsigned_int>(&local_f0,"%08x",&blockindex->nBits);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_550,&local_f0);
    key_08._M_string_length._4_4_ = iVar3;
    key_08._0_12_ = in_stack_fffffffffffff848;
    key_08.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_08.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_08.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_08._0_8_ = in_stack_fffffffffffff868;
    val_08.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_08.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_08.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_08,val_08);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_550.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_550.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550.val._M_dataplus._M_p != &local_550.val.field_2) {
      operator_delete(local_550.val._M_dataplus._M_p,local_550.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_4f8[0] != local_4e8) {
      operator_delete(local_4f8[0],local_4e8[0] + 1);
    }
    local_570[0] = local_560;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"difficulty","");
    local_f0._M_dataplus._M_p = (pointer)GetDifficulty(blockindex);
    UniValue::UniValue<double,_double,_true>(&local_5c8,(double *)&local_f0);
    key_09._M_string_length._4_4_ = iVar3;
    key_09._0_12_ = in_stack_fffffffffffff848;
    key_09.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_09.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_09.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_09._0_8_ = in_stack_fffffffffffff868;
    val_09.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_09.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_09.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_09,val_09);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5c8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8.val._M_dataplus._M_p != &local_5c8.val.field_2) {
      operator_delete(local_5c8.val._M_dataplus._M_p,local_5c8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_570[0] != local_560) {
      operator_delete(local_570[0],local_560[0] + 1);
    }
    local_5e8[0] = local_5d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"chainwork","");
    base_uint<256u>::GetHex_abi_cxx11_(&local_f0,&blockindex->nChainWork);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_640,&local_f0);
    key_10._M_string_length._4_4_ = iVar3;
    key_10._0_12_ = in_stack_fffffffffffff848;
    key_10.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_10.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_10.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_10._0_8_ = in_stack_fffffffffffff868;
    val_10.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_10.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_10.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_10,val_10);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_640.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_640.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640.val._M_dataplus._M_p != &local_640.val.field_2) {
      operator_delete(local_640.val._M_dataplus._M_p,local_640.val.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_5e8[0] != local_5d8) {
      operator_delete(local_5e8[0],local_5d8[0] + 1);
    }
    local_660[0] = local_650;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"nTx","");
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_6b8,&blockindex->nTx);
    key_11._M_string_length._4_4_ = iVar3;
    key_11._0_12_ = in_stack_fffffffffffff848;
    key_11.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
    key_11.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
    val_11.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
    val_11._0_8_ = in_stack_fffffffffffff868;
    val_11.val._M_string_length = in_stack_fffffffffffff878._0_8_;
    val_11.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_fffffffffffff878._8_16_;
    val_11.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff878._24_24_;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
    UniValue::pushKV(__return_storage_ptr__,key_11,val_11);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6b8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8.val._M_dataplus._M_p != &local_6b8.val.field_2) {
      operator_delete(local_6b8.val._M_dataplus._M_p,local_6b8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_660[0] != local_650) {
      operator_delete(local_660[0],local_650[0] + 1);
    }
    if (blockindex->pprev != (CBlockIndex *)0x0) {
      local_6d8[0] = local_6c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"previousblockhash","");
      puVar2 = blockindex->pprev->phashBlock;
      if (puVar2 == (uint256 *)0x0) goto LAB_00297d88;
      local_118 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
      uStack_110 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
      local_108 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_100 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::GetHex_abi_cxx11_(&local_f0,&local_118);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_730,&local_f0);
      key_12._M_string_length._4_4_ = iVar3;
      key_12._0_12_ = in_stack_fffffffffffff848;
      key_12.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
      key_12.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
      val_12.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
      val_12._0_8_ = in_stack_fffffffffffff868;
      val_12.val._M_string_length = in_stack_fffffffffffff878._0_8_;
      val_12.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )in_stack_fffffffffffff878._8_16_;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffff878._24_24_;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8b0;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
      UniValue::pushKV(__return_storage_ptr__,key_12,val_12);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_730.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_730.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730.val._M_dataplus._M_p != &local_730.val.field_2) {
        operator_delete(local_730.val._M_dataplus._M_p,
                        local_730.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_6d8[0] != local_6c8) {
        operator_delete(local_6d8[0],local_6c8[0] + 1);
      }
    }
    if (pCVar4 != (CBlockIndex *)0x0) {
      plVar5 = local_740;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff8b0,"nextblockhash","");
      puVar2 = pCVar4->phashBlock;
      if (puVar2 == (uint256 *)0x0) goto LAB_00297d88;
      local_118 = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
      uStack_110 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
      local_108 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_100 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
      base_blob<256u>::GetHex_abi_cxx11_(&local_f0,&local_118);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)&stack0xfffffffffffff858,&local_f0);
      key_13._M_string_length._4_4_ = iVar3;
      key_13._0_12_ = in_stack_fffffffffffff848;
      key_13.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
      key_13.field_2._8_8_ = in_stack_fffffffffffff860._M_p;
      val_13.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff870;
      val_13._0_8_ = in_stack_fffffffffffff868;
      val_13.val._M_string_length = in_stack_fffffffffffff878._0_8_;
      val_13.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )in_stack_fffffffffffff878._8_16_;
      val_13.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffff878._24_24_;
      val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff878._48_8_;
      val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar5;
      val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8b8;
      UniValue::pushKV(__return_storage_ptr__,key_13,val_13);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffff898);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff880);
      if (in_stack_fffffffffffff860._M_p != &stack0xfffffffffffff870) {
        operator_delete(in_stack_fffffffffffff860._M_p,in_stack_fffffffffffff870 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (plVar5 != local_740) {
        operator_delete(plVar5,local_740[0] + 1);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
LAB_00297d88:
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

UniValue blockheaderToJSON(const CBlockIndex& tip, const CBlockIndex& blockindex)
{
    // Serialize passed information without accessing chain state of the active chain!
    AssertLockNotHeld(cs_main); // For performance reasons

    UniValue result(UniValue::VOBJ);
    result.pushKV("hash", blockindex.GetBlockHash().GetHex());
    const CBlockIndex* pnext;
    int confirmations = ComputeNextBlockAndDepth(tip, blockindex, pnext);
    result.pushKV("confirmations", confirmations);
    result.pushKV("height", blockindex.nHeight);
    result.pushKV("version", blockindex.nVersion);
    result.pushKV("versionHex", strprintf("%08x", blockindex.nVersion));
    result.pushKV("merkleroot", blockindex.hashMerkleRoot.GetHex());
    result.pushKV("time", blockindex.nTime);
    result.pushKV("mediantime", blockindex.GetMedianTimePast());
    result.pushKV("nonce", blockindex.nNonce);
    result.pushKV("bits", strprintf("%08x", blockindex.nBits));
    result.pushKV("difficulty", GetDifficulty(blockindex));
    result.pushKV("chainwork", blockindex.nChainWork.GetHex());
    result.pushKV("nTx", blockindex.nTx);

    if (blockindex.pprev)
        result.pushKV("previousblockhash", blockindex.pprev->GetBlockHash().GetHex());
    if (pnext)
        result.pushKV("nextblockhash", pnext->GetBlockHash().GetHex());
    return result;
}